

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Partial.cpp
# Opt level: O2

bool __thiscall
MT32Emu::Partial::doProduceOutput<float,MT32Emu::LA32FloatPartialPair>
          (Partial *this,float *leftBuf,float *rightBuf,Bit32u length,
          LA32FloatPartialPair *la32PairImpl)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  float *local_40;
  float *local_38;
  
  local_40 = rightBuf;
  local_38 = leftBuf;
  bVar1 = canProduceOutput(this);
  if (bVar1) {
    this->alreadyOutputed = true;
    uVar3 = 0;
    while (this->sampleNum = uVar3, uVar3 < length) {
      bVar2 = generateNextSample<MT32Emu::LA32FloatPartialPair>(this,la32PairImpl);
      if (!bVar2) break;
      produceAndMixSample(this,&local_38,&local_40,la32PairImpl);
      uVar3 = this->sampleNum + 1;
    }
    this->sampleNum = 0;
  }
  return bVar1;
}

Assistant:

bool Partial::doProduceOutput(Sample *leftBuf, Sample *rightBuf, Bit32u length, LA32PairImpl *la32PairImpl) {
	if (!canProduceOutput()) return false;
	alreadyOutputed = true;

	for (sampleNum = 0; sampleNum < length; sampleNum++) {
		if (!generateNextSample(la32PairImpl)) break;
		produceAndMixSample(leftBuf, rightBuf, la32PairImpl);
	}
	sampleNum = 0;
	return true;
}